

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O3

void Rml::ReleaseFontResources(void)

{
  NodePtr pDVar1;
  ulong uVar2;
  code *pcVar3;
  undefined8 uVar4;
  ulong *puVar5;
  bool bVar6;
  Element *this;
  ulong uVar8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>_>
  *name_context;
  ulong *puVar9;
  uint8_t *puVar10;
  iterator iVar11;
  iterator iVar12;
  NodePtr pDVar7;
  
  if (font_interface == (long *)0x0) {
    return;
  }
  if ((core_data._8_8_ != 0) ||
     (bVar6 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46), bVar6)) {
    uVar4 = core_data._8_8_;
    iVar11 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(core_data._8_8_ + 0x38));
    pDVar7 = iVar11.mKeyVals;
    pDVar1 = *(NodePtr *)(uVar4 + 0x40);
    while (pDVar7 != pDVar1) {
      puVar10 = iVar11.mInfo;
      this = Context::GetRootElement
                       (((iVar11.mKeyVals)->mData).second._M_t.
                        super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
                        super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
                        super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl);
      Element::DirtyFontFaceRecursive(this);
      pDVar7 = iVar11.mKeyVals + 1;
      uVar8 = *(ulong *)(puVar10 + 1);
      if (uVar8 == 0) {
        puVar5 = (ulong *)(puVar10 + 9);
        do {
          puVar9 = puVar5;
          pDVar7 = pDVar7 + 8;
          uVar8 = *puVar9;
          puVar5 = puVar9 + 1;
        } while (uVar8 == 0);
      }
      else {
        puVar9 = (ulong *)(puVar10 + 1);
      }
      uVar2 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar8 = uVar2 >> 3 & 0x1fffffff;
      pDVar7 = pDVar7 + uVar8;
      iVar11.mInfo = (uint8_t *)((long)puVar9 + uVar8);
      iVar11.mKeyVals = pDVar7;
    }
    (**(code **)(*font_interface + 0x60))();
    if ((core_data._8_8_ != 0) ||
       (bVar6 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), bVar6)) {
      uVar4 = core_data._8_8_;
      iVar12 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(core_data._8_8_ + 0x38));
      pDVar7 = iVar12.mKeyVals;
      pDVar1 = *(NodePtr *)(uVar4 + 0x40);
      while (pDVar7 != pDVar1) {
        puVar10 = iVar12.mInfo;
        Context::Update(((iVar12.mKeyVals)->mData).second._M_t.
                        super___uniq_ptr_impl<Rml::Context,_Rml::Releaser<Rml::Context>_>._M_t.
                        super__Tuple_impl<0UL,_Rml::Context_*,_Rml::Releaser<Rml::Context>_>.
                        super__Head_base<0UL,_Rml::Context_*,_false>._M_head_impl);
        pDVar7 = iVar12.mKeyVals + 1;
        uVar8 = *(ulong *)(puVar10 + 1);
        if (uVar8 == 0) {
          puVar5 = (ulong *)(puVar10 + 9);
          do {
            puVar9 = puVar5;
            pDVar7 = pDVar7 + 8;
            uVar8 = *puVar9;
            puVar5 = puVar9 + 1;
          } while (uVar8 == 0);
        }
        else {
          puVar9 = (ulong *)(puVar10 + 1);
        }
        uVar2 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar8 = uVar2 >> 3 & 0x1fffffff;
        pDVar7 = pDVar7 + uVar8;
        iVar12.mInfo = (uint8_t *)((long)puVar9 + uVar8);
        iVar12.mKeyVals = pDVar7;
      }
      return;
    }
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void ReleaseFontResources()
{
	if (!font_interface)
		return;

	for (const auto& name_context : core_data->contexts)
		name_context.second->GetRootElement()->DirtyFontFaceRecursive();

	font_interface->ReleaseFontResources();

	for (const auto& name_context : core_data->contexts)
		name_context.second->Update();
}